

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getters-setters.c
# Opt level: O0

int run_test_req_type_name(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = (char *)uv_req_type_name(1);
  iVar1 = strcmp(pcVar2,"req");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x17,"strcmp(uv_req_type_name(UV_REQ), \"req\") == 0");
    abort();
  }
  pcVar2 = (char *)uv_req_type_name(5);
  iVar1 = strcmp(pcVar2,"udp_send");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x18,"strcmp(uv_req_type_name(UV_UDP_SEND), \"udp_send\") == 0");
    abort();
  }
  pcVar2 = (char *)uv_req_type_name(7);
  iVar1 = strcmp(pcVar2,"work");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x19,"strcmp(uv_req_type_name(UV_WORK), \"work\") == 0");
    abort();
  }
  lVar3 = uv_req_type_name(0xb);
  if (lVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x1a,"uv_req_type_name(UV_REQ_TYPE_MAX) == NULL");
    abort();
  }
  lVar3 = uv_req_type_name(0xc);
  if (lVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x1b,"uv_req_type_name(UV_REQ_TYPE_MAX + 1) == NULL");
    abort();
  }
  lVar3 = uv_req_type_name(0);
  if (lVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getters-setters.c"
            ,0x1c,"uv_req_type_name(UV_UNKNOWN_REQ) == NULL");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(req_type_name) {
  ASSERT(strcmp(uv_req_type_name(UV_REQ), "req") == 0);
  ASSERT(strcmp(uv_req_type_name(UV_UDP_SEND), "udp_send") == 0);
  ASSERT(strcmp(uv_req_type_name(UV_WORK), "work") == 0);
  ASSERT(uv_req_type_name(UV_REQ_TYPE_MAX) == NULL);
  ASSERT(uv_req_type_name(UV_REQ_TYPE_MAX + 1) == NULL);
  ASSERT(uv_req_type_name(UV_UNKNOWN_REQ) == NULL);
  return 0;
}